

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::ToString(SQVM *this,SQObjectPtr *o,SQObjectPtr *res)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQSharedState *this_00;
  SQTable *pSVar5;
  bool bVar6;
  int iVar7;
  SQChar *pSVar8;
  SQChar *pSVar9;
  SQString *pSVar10;
  SQMetaMethod mm;
  char *__format;
  SQObjectPtr closure;
  SQObjectPtr local_38;
  
  SVar2 = (o->super_SQObject)._type;
  if ((int)SVar2 < 0x8000010) {
    if (SVar2 == OT_BOOL) {
      pSVar8 = SQSharedState::GetScratchPad(this->_sharedstate,6);
      __format = "true";
      if ((o->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
        __format = "false";
      }
      snprintf(pSVar8,6,__format);
    }
    else if (SVar2 == OT_INTEGER) {
      pSVar8 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar8,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
    }
    else {
      if (SVar2 != OT_FLOAT) goto LAB_0012d615;
      pSVar8 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar8,0x32,"%g",(double)(o->super_SQObject)._unVal.fFloat);
    }
  }
  else {
    if ((int)SVar2 < 0xa000080) {
      if (SVar2 == OT_STRING) {
        SVar2 = (res->super_SQObject)._type;
        pSVar5 = (res->super_SQObject)._unVal.pTable;
        pSVar4 = (o->super_SQObject)._unVal.pTable;
        (res->super_SQObject)._unVal.pTable = pSVar4;
        SVar3 = (o->super_SQObject)._type;
        (res->super_SQObject)._type = SVar3;
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        goto joined_r0x0012d725;
      }
      if (SVar2 == OT_TABLE) goto LAB_0012d5ad;
    }
    else if ((SVar2 == OT_USERDATA) || (SVar2 == OT_INSTANCE)) {
LAB_0012d5ad:
      pSVar5 = (o->super_SQObject)._unVal.pTable;
      if ((pSVar5->super_SQDelegable)._delegate != (SQTable *)0x0) {
        local_38.super_SQObject._type = OT_NULL;
        local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
        iVar7 = (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[6])(pSVar5,this,0xf);
        if ((char)iVar7 != '\0') {
          Push(this,o);
          bVar6 = CallMetaMethod(this,&local_38,mm,1,res);
          if (!bVar6 || (res->super_SQObject)._type == OT_STRING) {
            SQObjectPtr::~SQObjectPtr(&local_38);
            return bVar6;
          }
        }
        SQObjectPtr::~SQObjectPtr(&local_38);
      }
    }
LAB_0012d615:
    pSVar8 = SQSharedState::GetScratchPad(this->_sharedstate,0x42);
    pSVar9 = GetTypeName(o);
    snprintf(pSVar8,0x42,"(%s : 0x%p)",pSVar9,(o->super_SQObject)._unVal.pTable);
  }
  this_00 = this->_sharedstate;
  pSVar8 = SQSharedState::GetScratchPad(this_00,-1);
  pSVar10 = SQString::Create(this_00,pSVar8,-1);
  pSVar5 = (res->super_SQObject)._unVal.pTable;
  SVar2 = (res->super_SQObject)._type;
  (res->super_SQObject)._type = OT_STRING;
  (res->super_SQObject)._unVal.pString = pSVar10;
  pSVar1 = &(pSVar10->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
joined_r0x0012d725:
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return true;
}

Assistant:

bool SQVM::ToString(const SQObjectPtr &o,SQObjectPtr &res)
{
    switch(type(o)) {
    case OT_STRING:
        res = o;
        return true;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_SC("%g"),_float(o));
        break;
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_PRINT_INT_FMT,_integer(o));
        break;
    case OT_BOOL:
        scsprintf(_sp(sq_rsl(6)),sq_rsl(6),_integer(o)?_SC("true"):_SC("false"));
        break;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_TOSTRING, closure)) {
                Push(o);
                if(CallMetaMethod(closure,MT_TOSTRING,1,res)) {
                    if(type(res) == OT_STRING)
                        return true;
                }
                else {
                    return false;
                }
            }
        }
    default:
        scsprintf(_sp(sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR)),sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR),_SC("(%s : 0x%p)"),GetTypeName(o),(void*)_rawval(o));
    }
    res = SQString::Create(_ss(this),_spval);
    return true;
}